

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O2

EStatusCode __thiscall
DecryptionHelper::Setup(DecryptionHelper *this,PDFParser *inParser,string *inPassword)

{
  ByteList *inO;
  StringToXCryptionCommonMap *this_00;
  ByteList *inFileIDPart1;
  PDFName *pPVar1;
  bool bVar2;
  uint uVar3;
  PDFDictionary *pPVar4;
  PDFObject *pPVar5;
  string *psVar6;
  Trace *pTVar7;
  longlong lVar8;
  unsigned_long uVar9;
  XCryptionCommon *pXVar10;
  ByteList password;
  allocator<char> local_141;
  PDFObjectCastPtr<PDFDictionary> encryptionDictionary;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  cryptFiltersIt;
  PDFObjectCastPtr<PDFName> streamsFilterName;
  PDFObjectCastPtr<PDFName> stringsFilterName;
  ParsedPrimitiveHelper idPart1ObjectHelper;
  RefCountPtr<PDFObject> length;
  RefCountPtr<PDFObject> p;
  RefCountPtr<PDFObject> u;
  RefCountPtr<PDFObject> lengthObject;
  PDFObjectCastPtr<PDFName> filter;
  PDFObjectCastPtr<PDFArray> idArray;
  PDFObjectCastPtr<PDFBoolean> encryptMetadata;
  RefCountPtr<PDFObject> o;
  RefCountPtr<PDFObject> revision;
  RefCountPtr<PDFObject> v;
  
  this->mSupportsDecryption = false;
  this->mFailedPasswordVerification = false;
  this->mDidSucceedOwnerPasswordVerification = false;
  this->mParser = inParser;
  pPVar4 = PDFParser::GetTrailer(inParser);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&password,"Encrypt",(allocator<char> *)&cryptFiltersIt);
  pPVar5 = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password);
  encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue =
       PDFObjectCast<PDFDictionary>(pPVar5);
  encryptionDictionary.super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_0036d8c0;
  std::__cxx11::string::~string((string *)&password);
  pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
  this->mIsEncrypted =
       encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue != (PDFDictionary *)0x0;
  if (encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue == (PDFDictionary *)0x0)
  goto LAB_001cbb14;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&password,"Filter",(allocator<char> *)&cryptFiltersIt);
  pPVar5 = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password);
  filter.super_RefCountPtr<PDFName>.mValue = PDFObjectCast<PDFName>(pPVar5);
  filter.super_RefCountPtr<PDFName>._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d998;
  std::__cxx11::string::~string((string *)&password);
  if (filter.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0) {
LAB_001cb02c:
    pTVar7 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar7,"DecryptionHelper::Setup, no filter defined");
  }
  else {
    psVar6 = PDFName::GetValue_abi_cxx11_(filter.super_RefCountPtr<PDFName>.mValue);
    bVar2 = std::operator!=(psVar6,"Standard");
    pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
    if (bVar2) {
      if (filter.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0) goto LAB_001cb02c;
      pTVar7 = Trace::DefaultTrace();
      psVar6 = PDFName::GetValue_abi_cxx11_(filter.super_RefCountPtr<PDFName>.mValue);
      std::__cxx11::string::substr((ulong)&password,(ulong)psVar6);
      Trace::TraceToLog(pTVar7,
                        "DecryptionHelper::Setup, Only Standard encryption filter is supported. Unsupported filter encountered - %s"
                        ,password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl._M_node.super__List_node_base._M_next);
      std::__cxx11::string::~string((string *)&password);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&password,"V",(allocator<char> *)&cryptFiltersIt);
      v.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password);
      v._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
      std::__cxx11::string::~string((string *)&password);
      if (v.mValue == (PDFObject *)0x0) {
        this->mV = 0;
LAB_001cb409:
        pTVar7 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar7,
                          "DecryptionHelper::Setup, Only 1 and 2 are supported values for V. Unsupported filter encountered - %d"
                          ,(ulong)this->mV);
      }
      else {
        ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password,v.mValue);
        bVar2 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
        if (bVar2) {
          lVar8 = ParsedPrimitiveHelper::GetAsInteger((ParsedPrimitiveHelper *)&password);
          this->mV = (uint)lVar8;
          ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
          pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
          if ((4 < this->mV) || ((0x16U >> (this->mV & 0x1f) & 1) == 0)) goto LAB_001cb409;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&password,"R",(allocator<char> *)&cryptFiltersIt);
          revision.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password);
          revision._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
          std::__cxx11::string::~string((string *)&password);
          if (revision.mValue != (PDFObject *)0x0) {
            ParsedPrimitiveHelper::ParsedPrimitiveHelper
                      ((ParsedPrimitiveHelper *)&password,revision.mValue);
            bVar2 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
            if (bVar2) {
              lVar8 = ParsedPrimitiveHelper::GetAsInteger((ParsedPrimitiveHelper *)&password);
              this->mRevision = (uint)lVar8;
              ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
              pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&password,"O",(allocator<char> *)&cryptFiltersIt);
              o.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password);
              o._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
              std::__cxx11::string::~string((string *)&password);
              if (o.mValue != (PDFObject *)0x0) {
                ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&u,o.mValue);
                ParsedPrimitiveHelper::ToString_abi_cxx11_
                          ((string *)&password,(ParsedPrimitiveHelper *)&u);
                XCryptionCommon::stringToByteList((ByteList *)&cryptFiltersIt,(string *)&password);
                inO = &this->mO;
                std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                          (inO,(_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &cryptFiltersIt);
                std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
                          ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &cryptFiltersIt);
                std::__cxx11::string::~string((string *)&password);
                ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&u);
                pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&password,"U",(allocator<char> *)&cryptFiltersIt);
                u.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password);
                u._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
                std::__cxx11::string::~string((string *)&password);
                if (u.mValue != (PDFObject *)0x0) {
                  ParsedPrimitiveHelper::ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&p,u.mValue)
                  ;
                  ParsedPrimitiveHelper::ToString_abi_cxx11_
                            ((string *)&password,(ParsedPrimitiveHelper *)&p);
                  XCryptionCommon::stringToByteList((ByteList *)&cryptFiltersIt,(string *)&password)
                  ;
                  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                            (&this->mU,
                             (_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &cryptFiltersIt);
                  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear
                            ((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &cryptFiltersIt);
                  std::__cxx11::string::~string((string *)&password);
                  ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&p);
                  pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&password,"P",(allocator<char> *)&cryptFiltersIt);
                  p.mValue = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password);
                  p._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
                  std::__cxx11::string::~string((string *)&password);
                  if (p.mValue != (PDFObject *)0x0) {
                    ParsedPrimitiveHelper::ParsedPrimitiveHelper
                              ((ParsedPrimitiveHelper *)&password,p.mValue);
                    bVar2 = ParsedPrimitiveHelper::IsNumber((ParsedPrimitiveHelper *)&password);
                    if (bVar2) {
                      lVar8 = ParsedPrimitiveHelper::GetAsInteger
                                        ((ParsedPrimitiveHelper *)&password);
                      this->mP = lVar8;
                      ParsedPrimitiveHelper::~ParsedPrimitiveHelper
                                ((ParsedPrimitiveHelper *)&password);
                      pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&password,"EncryptMetadata",
                                 (allocator<char> *)&cryptFiltersIt);
                      pPVar5 = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password)
                      ;
                      encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue =
                           PDFObjectCast<PDFBoolean>(pPVar5);
                      encryptMetadata.super_RefCountPtr<PDFBoolean>._vptr_RefCountPtr =
                           (_func_int **)&PTR__RefCountPtr_0036f128;
                      std::__cxx11::string::~string((string *)&password);
                      if (encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue == (PDFBoolean *)0x0)
                      {
                        this->mEncryptMetaData = true;
                      }
                      else {
                        bVar2 = PDFBoolean::GetValue
                                          (encryptMetadata.super_RefCountPtr<PDFBoolean>.mValue);
                        this->mEncryptMetaData = bVar2;
                      }
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node._M_size = 0;
                      inFileIDPart1 = &this->mFileIDPart1;
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&password;
                      password.super__List_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&password;
                      std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_move_assign(inFileIDPart1,(_List_node_base *)&password);
                      std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_clear((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &password);
                      pPVar4 = PDFParser::GetTrailer(inParser);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&password,"ID",(allocator<char> *)&cryptFiltersIt);
                      pPVar5 = PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password)
                      ;
                      idArray.super_RefCountPtr<PDFArray>.mValue = PDFObjectCast<PDFArray>(pPVar5);
                      idArray.super_RefCountPtr<PDFArray>._vptr_RefCountPtr =
                           (_func_int **)&PTR__RefCountPtr_0036d8f8;
                      std::__cxx11::string::~string((string *)&password);
                      if (idArray.super_RefCountPtr<PDFArray>.mValue != (PDFArray *)0x0) {
                        uVar9 = PDFArray::GetLength(idArray.super_RefCountPtr<PDFArray>.mValue);
                        if (uVar9 != 0) {
                          length.mValue =
                               PDFParser::QueryArrayObject
                                         (inParser,idArray.super_RefCountPtr<PDFArray>.mValue,0);
                          length._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
                          if (length.mValue != (PDFObject *)0x0) {
                            ParsedPrimitiveHelper::ParsedPrimitiveHelper
                                      (&idPart1ObjectHelper,length.mValue);
                            ParsedPrimitiveHelper::ToString_abi_cxx11_
                                      ((string *)&password,&idPart1ObjectHelper);
                            XCryptionCommon::stringToByteList
                                      ((ByteList *)&cryptFiltersIt,(string *)&password);
                            std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::
                            _M_move_assign(inFileIDPart1,
                                           (_List_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            *)&cryptFiltersIt);
                            std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ::_M_clear((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &cryptFiltersIt);
                            std::__cxx11::string::~string((string *)&password);
                            ParsedPrimitiveHelper::~ParsedPrimitiveHelper(&idPart1ObjectHelper);
                          }
                          RefCountPtr<PDFObject>::~RefCountPtr(&length);
                        }
                      }
                      pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&password,"Length",(allocator<char> *)&cryptFiltersIt);
                      length.mValue =
                           PDFParser::QueryDictionaryObject(inParser,pPVar4,(string *)&password);
                      length._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
                      std::__cxx11::string::~string((string *)&password);
                      if (length.mValue == (PDFObject *)0x0) {
                        uVar3 = 5;
                      }
                      else {
                        uVar3 = ComputeByteLength(length.mValue);
                      }
                      pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                      this->mLength = uVar3;
                      if (this->mV == 4) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&password,"CF",(allocator<char> *)&cryptFiltersIt);
                        pPVar5 = PDFParser::QueryDictionaryObject
                                           (inParser,pPVar4,(string *)&password);
                        pPVar4 = PDFObjectCast<PDFDictionary>(pPVar5);
                        idPart1ObjectHelper.mWrappedObject = (PDFObject *)&PTR__RefCountPtr_0036d8c0
                        ;
                        std::__cxx11::string::~string((string *)&password);
                        if (pPVar4 != (PDFDictionary *)0x0) {
                          PDFDictionary::GetIterator(&cryptFiltersIt,pPVar4);
                          this_00 = &this->mXcrypts;
                          while( true ) {
                            bVar2 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                    ::MoveNext(&cryptFiltersIt.
                                                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                              );
                            pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                            if (!bVar2) break;
                            streamsFilterName.super_RefCountPtr<PDFName>.mValue = (PDFName *)0x0;
                            streamsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                                 (_func_int **)&PTR__RefCountPtr_0036d8c0;
                            PDFObjectCastPtr<PDFDictionary>::operator=
                                      ((PDFObjectCastPtr<PDFDictionary> *)&streamsFilterName,
                                       (PDFObject *)
                                       cryptFiltersIt.
                                       super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                       .mCurrentPosition._M_node[1]._M_parent);
                            pPVar1 = streamsFilterName.super_RefCountPtr<PDFName>.mValue;
                            if (streamsFilterName.super_RefCountPtr<PDFName>.mValue !=
                                (PDFName *)0x0) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&password,"CFM",(allocator<char> *)&lengthObject)
                              ;
                              pPVar5 = PDFParser::QueryDictionaryObject
                                                 (inParser,(PDFDictionary *)pPVar1,
                                                  (string *)&password);
                              stringsFilterName.super_RefCountPtr<PDFName>.mValue =
                                   PDFObjectCast<PDFName>(pPVar5);
                              stringsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                                   (_func_int **)&PTR__RefCountPtr_0036d998;
                              std::__cxx11::string::~string((string *)&password);
                              pPVar1 = streamsFilterName.super_RefCountPtr<PDFName>.mValue;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&password,"Length",&local_141);
                              lengthObject.mValue =
                                   PDFParser::QueryDictionaryObject
                                             (inParser,(PDFDictionary *)pPVar1,(string *)&password);
                              lengthObject._vptr_RefCountPtr =
                                   (_func_int **)&PTR__RefCountPtr_0036d890;
                              std::__cxx11::string::~string((string *)&password);
                              if (lengthObject.mValue == (PDFObject *)0x0) {
                                uVar3 = this->mLength;
                              }
                              else {
                                uVar3 = ComputeByteLength(lengthObject.mValue);
                              }
                              pXVar10 = (XCryptionCommon *)operator_new(0x58);
                              XCryptionCommon::XCryptionCommon(pXVar10);
                              psVar6 = PDFName::GetValue_abi_cxx11_
                                                 (stringsFilterName.super_RefCountPtr<PDFName>.
                                                  mValue);
                              bVar2 = std::operator==(psVar6,"AESV2");
                              XCryptionCommon::Setup(pXVar10,bVar2);
                              XCryptionCommon::SetupInitialEncryptionKey
                                        (pXVar10,inPassword,this->mRevision,uVar3,inO,this->mP,
                                         inFileIDPart1,this->mEncryptMetaData);
                              psVar6 = PDFName::GetValue_abi_cxx11_
                                                 (*(PDFName **)
                                                   (cryptFiltersIt.
                                                                                                        
                                                  super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                                  .mCurrentPosition._M_node + 1));
                              std::__cxx11::string::string((string *)&password,(string *)psVar6);
                              std::
                              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                              ::
                              _M_insert_unique<std::pair<std::__cxx11::string_const,XCryptionCommon*>>
                                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                                          *)this_00,
                                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                                          *)&password);
                              std::__cxx11::string::~string((string *)&password);
                              RefCountPtr<PDFObject>::~RefCountPtr(&lengthObject);
                              RefCountPtr<PDFName>::~RefCountPtr
                                        (&stringsFilterName.super_RefCountPtr<PDFName>);
                            }
                            RefCountPtr<PDFDictionary>::~RefCountPtr
                                      ((RefCountPtr<PDFDictionary> *)&streamsFilterName);
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&password,"StmF",
                                     (allocator<char> *)&stringsFilterName);
                          pPVar5 = PDFParser::QueryDictionaryObject
                                             (inParser,pPVar4,(string *)&password);
                          streamsFilterName.super_RefCountPtr<PDFName>.mValue =
                               PDFObjectCast<PDFName>(pPVar5);
                          streamsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                               (_func_int **)&PTR__RefCountPtr_0036d998;
                          std::__cxx11::string::~string((string *)&password);
                          pPVar4 = encryptionDictionary.super_RefCountPtr<PDFDictionary>.mValue;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&password,"StrF",(allocator<char> *)&lengthObject);
                          pPVar5 = PDFParser::QueryDictionaryObject
                                             (inParser,pPVar4,(string *)&password);
                          stringsFilterName.super_RefCountPtr<PDFName>.mValue =
                               PDFObjectCast<PDFName>(pPVar5);
                          stringsFilterName.super_RefCountPtr<PDFName>._vptr_RefCountPtr =
                               (_func_int **)&PTR__RefCountPtr_0036d998;
                          std::__cxx11::string::~string((string *)&password);
                          if (streamsFilterName.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0)
                          {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&password,"Identity",
                                       (allocator<char> *)&lengthObject);
                          }
                          else {
                            psVar6 = PDFName::GetValue_abi_cxx11_
                                               (streamsFilterName.super_RefCountPtr<PDFName>.mValue)
                            ;
                            std::__cxx11::string::string((string *)&password,(string *)psVar6);
                          }
                          pXVar10 = GetFilterForName(this_00,(string *)&password);
                          this->mXcryptStreams = pXVar10;
                          std::__cxx11::string::~string((string *)&password);
                          if (stringsFilterName.super_RefCountPtr<PDFName>.mValue == (PDFName *)0x0)
                          {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&password,"Identity",&local_141);
                          }
                          else {
                            psVar6 = PDFName::GetValue_abi_cxx11_
                                               (stringsFilterName.super_RefCountPtr<PDFName>.mValue)
                            ;
                            std::__cxx11::string::string((string *)&password,(string *)psVar6);
                          }
                          pXVar10 = GetFilterForName(this_00,(string *)&password);
                          this->mXcryptStrings = pXVar10;
                          std::__cxx11::string::~string((string *)&password);
                          pXVar10 = GetFilterForName(this_00,&scStdCF_abi_cxx11_);
                          this->mXcryptAuthentication = pXVar10;
                          RefCountPtr<PDFName>::~RefCountPtr
                                    (&stringsFilterName.super_RefCountPtr<PDFName>);
                          RefCountPtr<PDFName>::~RefCountPtr
                                    (&streamsFilterName.super_RefCountPtr<PDFName>);
                        }
                        RefCountPtr<PDFDictionary>::~RefCountPtr
                                  ((RefCountPtr<PDFDictionary> *)&idPart1ObjectHelper);
                      }
                      else {
                        pXVar10 = (XCryptionCommon *)operator_new(0x58);
                        XCryptionCommon::XCryptionCommon(pXVar10);
                        XCryptionCommon::Setup(pXVar10,false);
                        XCryptionCommon::SetupInitialEncryptionKey
                                  (pXVar10,inPassword,this->mRevision,this->mLength,inO,this->mP,
                                   inFileIDPart1,this->mEncryptMetaData);
                        std::__cxx11::string::string
                                  ((string *)&password,(string *)&scStdCF_abi_cxx11_);
                        std::
                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                        ::_M_insert_unique<std::pair<std::__cxx11::string_const,XCryptionCommon*>>
                                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                                    *)&this->mXcrypts,
                                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
                                    *)&password);
                        std::__cxx11::string::~string((string *)&password);
                        this->mXcryptStreams = pXVar10;
                        this->mXcryptStrings = pXVar10;
                        this->mXcryptAuthentication = pXVar10;
                      }
                      XCryptionCommon::stringToByteList(&password,inPassword);
                      bVar2 = AuthenticateOwnerPassword(this,&password);
                      this->mDidSucceedOwnerPasswordVerification = bVar2;
                      if (bVar2) {
                        bVar2 = false;
                      }
                      else {
                        bVar2 = AuthenticateUserPassword(this,&password);
                        bVar2 = !bVar2;
                      }
                      this->mFailedPasswordVerification = bVar2;
                      this->mSupportsDecryption = true;
                      std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::
                      _M_clear(&password.
                                super__List_base<unsigned_char,_std::allocator<unsigned_char>_>);
                      RefCountPtr<PDFObject>::~RefCountPtr(&length);
                      RefCountPtr<PDFArray>::~RefCountPtr(&idArray.super_RefCountPtr<PDFArray>);
                      RefCountPtr<PDFBoolean>::~RefCountPtr
                                (&encryptMetadata.super_RefCountPtr<PDFBoolean>);
                    }
                    else {
                      ParsedPrimitiveHelper::~ParsedPrimitiveHelper
                                ((ParsedPrimitiveHelper *)&password);
                    }
                  }
                  RefCountPtr<PDFObject>::~RefCountPtr(&p);
                }
                RefCountPtr<PDFObject>::~RefCountPtr(&u);
              }
              RefCountPtr<PDFObject>::~RefCountPtr(&o);
            }
            else {
              ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
            }
          }
          RefCountPtr<PDFObject>::~RefCountPtr(&revision);
        }
        else {
          ParsedPrimitiveHelper::~ParsedPrimitiveHelper((ParsedPrimitiveHelper *)&password);
        }
      }
      RefCountPtr<PDFObject>::~RefCountPtr(&v);
    }
  }
  RefCountPtr<PDFName>::~RefCountPtr(&filter.super_RefCountPtr<PDFName>);
LAB_001cbb14:
  RefCountPtr<PDFDictionary>::~RefCountPtr(&encryptionDictionary.super_RefCountPtr<PDFDictionary>);
  return eSuccess;
}

Assistant:

EStatusCode DecryptionHelper::Setup(PDFParser* inParser, const string& inPassword) {
	mSupportsDecryption = false;
	mFailedPasswordVerification = false;
	mDidSucceedOwnerPasswordVerification = false;
	mParser = inParser;

	// setup encrypted flag through the existance of encryption dict
	PDFObjectCastPtr<PDFDictionary> encryptionDictionary(inParser->QueryDictionaryObject(inParser->GetTrailer(), "Encrypt"));
	mIsEncrypted = encryptionDictionary.GetPtr() != NULL;

	do {
		if (!mIsEncrypted)
			break;

		PDFObjectCastPtr<PDFName> filter(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "Filter"));
		if (!filter || filter->GetValue() != "Standard") {
			// Supporting only standard filter
			if(!filter)
				TRACE_LOG("DecryptionHelper::Setup, no filter defined");
			else
				TRACE_LOG1("DecryptionHelper::Setup, Only Standard encryption filter is supported. Unsupported filter encountered - %s",filter->GetValue().substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}

		RefCountPtr<PDFObject> v(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "V"));
		if (!v) {
			mV = 0;
		} else {
			ParsedPrimitiveHelper vHelper(v.GetPtr());
			if (!vHelper.IsNumber())
				break;
			mV = (unsigned int)vHelper.GetAsInteger();
		}

		// supporting versions 1,2 and 4
		if (mV != 1 && mV != 2 && mV != 4) {
			TRACE_LOG1("DecryptionHelper::Setup, Only 1 and 2 are supported values for V. Unsupported filter encountered - %d", mV);
			break;
		}

		RefCountPtr<PDFObject> revision(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "R"));
		if (!revision) {
			break;
		}
		else {
			ParsedPrimitiveHelper revisionHelper(revision.GetPtr());
			if (!revisionHelper.IsNumber())
				break;
			mRevision = (unsigned int)revisionHelper.GetAsInteger();
		}

		RefCountPtr<PDFObject> o(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "O"));
		if (!o) {
			break;
		}
		else {
			ParsedPrimitiveHelper oHelper(o.GetPtr());
			mO = XCryptionCommon::stringToByteList(oHelper.ToString());
		}

		RefCountPtr<PDFObject> u(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "U"));
		if (!u) {
			break;
		}
		else {
			ParsedPrimitiveHelper uHelper(u.GetPtr());
			mU = XCryptionCommon::stringToByteList(uHelper.ToString());
		}

		RefCountPtr<PDFObject> p(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "P"));
		if (!p) {
			break;
		}
		else {
			ParsedPrimitiveHelper pHelper(p.GetPtr());
			if (!pHelper.IsNumber())
				break;
			mP = pHelper.GetAsInteger();
		}

		PDFObjectCastPtr<PDFBoolean> encryptMetadata(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "EncryptMetadata"));
		if (!encryptMetadata) {
			mEncryptMetaData = true;
		}
		else {
			mEncryptMetaData = encryptMetadata->GetValue();
		}

		// grab file ID from trailer
		mFileIDPart1 = ByteList();
		PDFObjectCastPtr<PDFArray> idArray(inParser->QueryDictionaryObject(inParser->GetTrailer(), "ID"));
		if (!!idArray && idArray->GetLength() > 0) {
			RefCountPtr<PDFObject> idPart1Object(inParser->QueryArrayObject(idArray.GetPtr(), 0));
			if (!!idPart1Object) {
				ParsedPrimitiveHelper idPart1ObjectHelper(idPart1Object.GetPtr());
				mFileIDPart1 = XCryptionCommon::stringToByteList(idPart1ObjectHelper.ToString());
			}
		}


		RefCountPtr<PDFObject> length(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "Length"));
		if (!length) {
			mLength = 40 / 8;
		}
		else {
			mLength = ComputeByteLength(length.GetPtr());
		}

		// Setup crypt filters, or a default filter
		if (mV == 4) {
			// multiple xcryptions. read crypt filters, determine which does what
			PDFObjectCastPtr<PDFDictionary> cryptFilters(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "CF"));
			if (!!cryptFilters) {
				MapIterator<PDFNameToPDFObjectMap>  cryptFiltersIt = cryptFilters->GetIterator();

				// read crypt filters
				while (cryptFiltersIt.MoveNext())
				{
					PDFObjectCastPtr<PDFDictionary> cryptFilter;
					// A little caveat of those smart ptrs need to be handled here
					// make sure to pass the pointer after init...otherwise cast wont do addref
					// and object will be released
					cryptFilter = cryptFiltersIt.GetValue();
					if (!!cryptFilter) {
						PDFObjectCastPtr<PDFName> cfmName(inParser->QueryDictionaryObject(cryptFilter.GetPtr(), "CFM"));
						RefCountPtr<PDFObject> lengthObject(inParser->QueryDictionaryObject(cryptFilter.GetPtr(), "Length"));
						unsigned int length = !lengthObject ? mLength : ComputeByteLength(lengthObject.GetPtr());

						XCryptionCommon* encryption = new XCryptionCommon();
						encryption->Setup(cfmName->GetValue() == "AESV2"); // singe xcryptions are always RC4
						encryption->SetupInitialEncryptionKey(
							inPassword,
							mRevision,
							length,
							mO,
							mP,
							mFileIDPart1,
							mEncryptMetaData);
						mXcrypts.insert(StringToXCryptionCommonMap::value_type(cryptFiltersIt.GetKey()->GetValue(), encryption));
					}
				}
				

				PDFObjectCastPtr<PDFName> streamsFilterName(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "StmF"));
				PDFObjectCastPtr<PDFName> stringsFilterName(inParser->QueryDictionaryObject(encryptionDictionary.GetPtr(), "StrF"));
				mXcryptStreams = GetFilterForName(mXcrypts, !streamsFilterName ? "Identity": streamsFilterName->GetValue());
				mXcryptStrings = GetFilterForName(mXcrypts, !stringsFilterName ? "Identity" : stringsFilterName->GetValue());
				mXcryptAuthentication = GetFilterForName(mXcrypts, scStdCF);
			}

		}
		else {
			// single xcryption, use as the single encryption source
			XCryptionCommon* defaultEncryption = new XCryptionCommon();
			defaultEncryption->Setup(false); // single xcryptions are always RC4
			defaultEncryption->SetupInitialEncryptionKey(
				inPassword,
				mRevision,
				mLength,
				mO,
				mP,
				mFileIDPart1,
				mEncryptMetaData);

			mXcrypts.insert(StringToXCryptionCommonMap::value_type(scStdCF, defaultEncryption));
			mXcryptStreams = defaultEncryption;
			mXcryptStrings = defaultEncryption;
			mXcryptAuthentication = defaultEncryption;
		}

		// authenticate password, try to determine if user or owner
		ByteList password = XCryptionCommon::stringToByteList(inPassword);
		mDidSucceedOwnerPasswordVerification = AuthenticateOwnerPassword(password);
		mFailedPasswordVerification = !mDidSucceedOwnerPasswordVerification && !AuthenticateUserPassword(password);


		mSupportsDecryption = true;
	}while(false);

	return eSuccess;
}